

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setEnabledLevelSet
          (VolumeMeshVertexScalarQuantity *this,bool v)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,v) != 0) {
    this->isDrawingLevelSet = true;
    (*(this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
      super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity[9])(this,1);
    VolumeMesh::setLevelSetQuantity
              ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
               super_QuantityS<polyscope::VolumeMesh>.parent,this);
    return;
  }
  this->isDrawingLevelSet = false;
  VolumeMesh::setLevelSetQuantity
            ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
             super_QuantityS<polyscope::VolumeMesh>.parent,(VolumeMeshVertexScalarQuantity *)0x0);
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setEnabledLevelSet(bool v) {
  if (v) {
    isDrawingLevelSet = true;
    setEnabled(true);
    parent.setLevelSetQuantity(this);
  } else {
    isDrawingLevelSet = false;
    parent.setLevelSetQuantity(nullptr);
  }
}